

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

int cea708_render(cea708_t *cea708,uint8_t *data,size_t size)

{
  byte bVar1;
  cc_data_t cVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  
  *data = (char)cea708->country;
  data[1] = *(byte *)((long)&cea708->provider + 1);
  data[2] = (char)cea708->provider;
  if (cea708->provider == t35_provider_atsc) {
    data[3] = *(uint8_t *)((long)&cea708->user_identifier + 3);
    data[4] = *(uint8_t *)((long)&cea708->user_identifier + 2);
    data[5] = *(uint8_t *)((long)&cea708->user_identifier + 1);
    data[6] = (uint8_t)cea708->user_identifier;
    pbVar5 = data + 7;
    lVar4 = 7;
  }
  else {
    pbVar5 = data + 3;
    lVar4 = 3;
  }
  if ((cea708->provider == t35_provider_atsc) || (cea708->provider == t35_provider_direct_tv)) {
    data[lVar4] = cea708->user_data_type_code;
    lVar4 = lVar4 + 1;
    pbVar5 = pbVar5 + 1;
  }
  if (cea708->provider == t35_provider_direct_tv) {
    *pbVar5 = cea708->directv_user_data_length;
    lVar4 = lVar4 + 1;
    pbVar5 = pbVar5 + 1;
  }
  pbVar5[1] = (cea708->user_data).field_0x1;
  bVar1 = *(byte *)&cea708->user_data;
  *pbVar5 = bVar1 >> 3 | (bVar1 & 2) << 5 | (bVar1 * '\x04' & 0x10 | bVar1 << 6) * '\x02';
  lVar4 = lVar4 + 2;
  iVar3 = (int)lVar4;
  pbVar5 = pbVar5 + 2;
  if ((undefined1  [132])((undefined1  [132])cea708->user_data & (undefined1  [132])0xf8) !=
      (undefined1  [132])0x0) {
    uVar6 = 0;
    do {
      cVar2 = (cea708->user_data).cc_data[uVar6];
      *pbVar5 = (byte)((uint)cVar2 >> 6) & 3 | ((byte)((uint)cVar2 >> 3) & 4) + cVar2._0_1_ * '\b';
      pbVar5[1] = (cea708->user_data).cc_data[uVar6].field_0x2;
      pbVar5[2] = (cea708->user_data).cc_data[uVar6].field_0x1;
      lVar4 = lVar4 + 3;
      iVar3 = (int)lVar4;
      pbVar5 = pbVar5 + 3;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (*(ushort *)&cea708->user_data >> 3 & 0x1f));
  }
  *pbVar5 = 0xff;
  return iVar3 + 1;
}

Assistant:

int cea708_render(cea708_t* cea708, uint8_t* data, size_t size)
{
    int i;
    size_t total = 0;
    data[0] = cea708->country;
    data[1] = cea708->provider >> 8;
    data[2] = cea708->provider >> 0;
    total += 3;
    data += 3;
    size -= 3;

    if (t35_provider_atsc == cea708->provider) {

        data[0] = cea708->user_identifier >> 24;
        data[1] = cea708->user_identifier >> 16;
        data[2] = cea708->user_identifier >> 8;
        data[3] = cea708->user_identifier >> 0;
        total += 4;
        data += 4;
        size -= 4;
    }

    if (t35_provider_atsc == cea708->provider || t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->user_data_type_code;
        total += 1;
        data += 1;
        size -= 1;
    }

    if (t35_provider_direct_tv == cea708->provider) {
        data[0] = cea708->directv_user_data_length;
        total += 1;
        data += 1;
        size -= 1;
    }

    data[1] = cea708->user_data.em_data;
    data[0] = (cea708->user_data.process_em_data_flag ? 0x80 : 0x00)
        | (cea708->user_data.process_cc_data_flag ? 0x40 : 0x00)
        | (cea708->user_data.additional_data_flag ? 0x20 : 0x00)
        | (cea708->user_data.cc_count & 0x1F);

    total += 2;
    data += 2;
    size -= 2;

    for (i = 0; i < (int)cea708->user_data.cc_count; ++i) {
        data[0] = (cea708->user_data.cc_data[i].marker_bits << 3) | (cea708->user_data.cc_data[i].cc_valid << 2) | cea708->user_data.cc_data[i].cc_type;
        data[1] = cea708->user_data.cc_data[i].cc_data >> 8;
        data[2] = cea708->user_data.cc_data[i].cc_data >> 0;
        total += 3;
        data += 3;
        size -= 3;
    }

    data[0] = 0xFF; //marker bits
    return (int)(total + 1);
}